

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O1

int set_file_identifier(uchar *bp,int from,int to,vdc vdc,archive_write *a,vdd *vdd,
                       archive_string *id,char *label,int leading_under,char_type char_type)

{
  vdd_type vVar1;
  int iVar2;
  isoent *piVar3;
  ulong uVar4;
  char *pcVar5;
  ulong __n;
  char local_138 [264];
  
  if ((leading_under == 0 || id->length == 0) || (pcVar5 = id->s, *pcVar5 == '_')) {
    if (id->length != 0) {
      pcVar5 = id->s;
      piVar3 = isoent_find_entry(vdd->rootent,pcVar5 + (leading_under != 0));
      if (piVar3 == (isoent *)0x0) {
        archive_set_error(&a->archive,-1,"Not Found %s `%s\'.",label,pcVar5 + (leading_under != 0));
        iVar2 = -0x1e;
      }
      else {
        uVar4 = (long)piVar3->ext_len + (long)piVar3->ext_off;
        vVar1 = vdd->vdd_type;
        if (vVar1 == VDD_JOLIET) {
          __n = 0xfe;
        }
        else {
          __n = 0xff;
        }
        if (uVar4 < __n) {
          __n = uVar4;
        }
        memcpy(local_138,piVar3->identifier,__n);
        local_138[__n] = '\0';
        if (vVar1 == VDD_JOLIET) {
          local_138[__n + 1] = '\0';
          vdc = VDC_UCS2_DIRECT;
        }
        if (char_type == A_CHAR) {
          iVar2 = set_str_a_characters_bp(a,bp,from,to,local_138,vdc);
        }
        else {
          iVar2 = set_str_d_characters_bp(a,bp,from,to,local_138,vdc);
        }
      }
      return iVar2;
    }
    pcVar5 = (char *)0x0;
  }
  if (char_type == A_CHAR) {
    iVar2 = set_str_a_characters_bp(a,bp,from,to,pcVar5,vdc);
    return iVar2;
  }
  iVar2 = set_str_d_characters_bp(a,bp,from,to,pcVar5,vdc);
  return iVar2;
}

Assistant:

static int
set_file_identifier(unsigned char *bp, int from, int to, enum vdc vdc,
    struct archive_write *a, struct vdd *vdd, struct archive_string *id,
    const char *label, int leading_under, enum char_type char_type)
{
	char identifier[256];
	struct isoent *isoent;
	const char *ids;
	size_t len;
	int r;

	if (id->length > 0 && leading_under && id->s[0] != '_') {
		if (char_type == A_CHAR)
			r = set_str_a_characters_bp(a, bp, from, to, id->s, vdc);
		else
			r = set_str_d_characters_bp(a, bp, from, to, id->s, vdc);
	} else if (id->length > 0) {
		ids = id->s;
		if (leading_under)
			ids++;
		isoent = isoent_find_entry(vdd->rootent, ids);
		if (isoent == NULL) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Not Found %s `%s'.",
			    label, ids);
			return (ARCHIVE_FATAL);
		}
		len = isoent->ext_off + isoent->ext_len;
		if (vdd->vdd_type == VDD_JOLIET) {
			if (len > sizeof(identifier)-2)
				len = sizeof(identifier)-2;
		} else {
			if (len > sizeof(identifier)-1)
				len = sizeof(identifier)-1;
		}
		memcpy(identifier, isoent->identifier, len);
		identifier[len] = '\0';
		if (vdd->vdd_type == VDD_JOLIET) {
			identifier[len+1] = 0;
			vdc = VDC_UCS2_DIRECT;
		}
		if (char_type == A_CHAR)
			r = set_str_a_characters_bp(a, bp, from, to,
			    identifier, vdc);
		else
			r = set_str_d_characters_bp(a, bp, from, to,
			    identifier, vdc);
	} else {
		if (char_type == A_CHAR)
			r = set_str_a_characters_bp(a, bp, from, to, NULL, vdc);
		else
			r = set_str_d_characters_bp(a, bp, from, to, NULL, vdc);
	}
	return (r);
}